

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O1

void Abc_WriteLayer(FILE *pFile,int nVars,int fSkip1)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  
  fprintf((FILE *)pFile,".model Layer%d\n");
  fwrite(".inputs",7,1,(FILE *)pFile);
  if (0 < nVars) {
    uVar2 = 0;
    do {
      fprintf((FILE *)pFile," x%02d",uVar2);
      uVar1 = (int)uVar2 + 1;
      uVar2 = (ulong)uVar1;
    } while (nVars != uVar1);
  }
  fputc(10,(FILE *)pFile);
  fwrite(".outputs",8,1,(FILE *)pFile);
  if (0 < nVars) {
    uVar2 = 0;
    do {
      fprintf((FILE *)pFile," y%02d",uVar2);
      uVar1 = (int)uVar2 + 1;
      uVar2 = (ulong)uVar1;
    } while (nVars != uVar1);
  }
  fputc(10,(FILE *)pFile);
  if (fSkip1 != 0) {
    fwrite(".names x00 y00\n",0xf,1,(FILE *)pFile);
    fwrite("1 1\n",4,1,(FILE *)pFile);
  }
  uVar1 = (uint)(fSkip1 != 0);
  iVar3 = uVar1 + 1;
  while (iVar3 < nVars) {
    fprintf((FILE *)pFile,".subckt Comp a=x%02d b=x%02d x=y%02d y=y%02d\n",(ulong)uVar1,
            (ulong)(uVar1 + 1),(ulong)uVar1,(ulong)(uVar1 + 1));
    iVar3 = uVar1 + 3;
    uVar1 = uVar1 + 2;
  }
  if ((int)uVar1 < nVars) {
    fprintf((FILE *)pFile,".names x%02d y%02d\n",(ulong)uVar1);
    fwrite("1 1\n",4,1,(FILE *)pFile);
  }
  fwrite(".end\n",5,1,(FILE *)pFile);
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Abc_WriteLayer( FILE * pFile, int nVars, int fSkip1 )
{
    int i;
    fprintf( pFile, ".model Layer%d\n", fSkip1 );
    fprintf( pFile, ".inputs" ); 
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " x%02d", i ); 
    fprintf( pFile, "\n" ); 
    fprintf( pFile, ".outputs" ); 
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " y%02d", i ); 
    fprintf( pFile, "\n" ); 
    if ( fSkip1 )
    {
        fprintf( pFile, ".names x00 y00\n" ); 
        fprintf( pFile, "1 1\n" ); 
        i = 1;
    }
    else
        i = 0;
    for ( ; i + 1 < nVars; i += 2 )
        fprintf( pFile, ".subckt Comp a=x%02d b=x%02d x=y%02d y=y%02d\n", i, i+1, i, i+1 );
    if ( i < nVars )
    {
        fprintf( pFile, ".names x%02d y%02d\n", i, i ); 
        fprintf( pFile, "1 1\n" ); 
    }
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" ); 
}